

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.h
# Opt level: O0

void uS::Socket::io_cb<uWS::WebSocket<true>>(uv_poll_t *p,int status,int events)

{
  bool bVar1;
  uv_os_sock_t uVar2;
  int length_00;
  uv_poll_cb p_Var3;
  ssize_t sVar4;
  int *piVar5;
  uint in_EDX;
  int in_ESI;
  uv_poll_t *in_RDI;
  int length;
  ssize_t sent;
  Message *messagePtr;
  NodeData *nodeData;
  SocketData *socketData;
  int in_stack_ffffffffffffff6c;
  uv_poll_t *in_stack_ffffffffffffff70;
  Socket local_88;
  Socket in_stack_ffffffffffffff80;
  Socket local_78;
  Socket in_stack_ffffffffffffff98;
  Socket in_stack_ffffffffffffffa0;
  Socket local_58;
  Socket local_50;
  size_t local_48;
  Message *local_40;
  Socket local_38;
  Socket local_30;
  NodeData *local_28;
  Socket local_20;
  SocketData *local_18;
  uint local_10;
  int local_c;
  uv_poll_t *local_8;
  
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  Socket(&local_20,in_RDI);
  local_18 = getSocketData(&local_20);
  local_28 = local_18->nodeData;
  if (local_c < 0) {
    Socket(&local_30,local_8);
    uWS::WebSocket<true>::onEnd(in_stack_ffffffffffffffa0);
  }
  else {
    if ((((local_10 & 2) != 0) &&
        (bVar1 = SocketData::Queue::empty(&local_18->messageQueue), !bVar1)) &&
       ((local_10 & 2) != 0)) {
      Socket(&local_38,local_8);
      cork((Socket *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
      do {
        local_40 = SocketData::Queue::front(&local_18->messageQueue);
        Socket(&local_50,local_8);
        uVar2 = getFd(&local_50);
        local_48 = send(uVar2,local_40->data,local_40->length,0x4000);
        if (local_48 != local_40->length) {
          if (local_48 == 0xffffffffffffffff) {
            piVar5 = __errno_location();
            if (*piVar5 != 0xb) {
              Socket((Socket *)&stack0xffffffffffffffa0,local_8);
              uWS::WebSocket<true>::onEnd(in_stack_ffffffffffffffa0);
              return;
            }
          }
          else {
            local_40->length = local_40->length - local_48;
            local_40->data = local_40->data + local_48;
          }
          goto LAB_001332fe;
        }
        if (local_40->callback != (_func_void_void_ptr_void_ptr_bool_void_ptr *)0x0) {
          (*local_40->callback)(local_8,local_40->callbackData,false,local_40->reserved);
        }
        SocketData::Queue::pop((Queue *)in_stack_ffffffffffffff80.p);
        bVar1 = SocketData::Queue::empty(&local_18->messageQueue);
      } while (!bVar1);
      local_18->poll = 1;
      in_stack_ffffffffffffff70 = local_8;
      Socket(&local_58,local_8);
      p_Var3 = getPollCallback(&local_58);
      uv_poll_start(in_stack_ffffffffffffff70,1,p_Var3);
LAB_001332fe:
      Socket((Socket *)&stack0xffffffffffffff98,local_8);
      cork((Socket *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    }
    if ((local_10 & 1) != 0) {
      Socket(&local_78,local_8);
      uVar2 = getFd(&local_78);
      sVar4 = recv(uVar2,local_28->recvBuffer,(long)local_28->recvLength,0);
      length_00 = (int)sVar4;
      if (length_00 < 1) {
        if ((length_00 < 1) || ((length_00 == -1 && (piVar5 = __errno_location(), *piVar5 != 0xb))))
        {
          Socket(&local_88,local_8);
          uWS::WebSocket<true>::onEnd(in_stack_ffffffffffffffa0);
        }
      }
      else {
        Socket((Socket *)&stack0xffffffffffffff80,local_8);
        uWS::WebSocket<true>::onData
                  (in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98.p,length_00);
      }
    }
  }
  return;
}

Assistant:

static void io_cb(uv_poll_t *p, int status, int events) {
        SocketData *socketData = Socket(p).getSocketData();
        NodeData *nodeData = socketData->nodeData;

        if (status < 0) {
            STATE::onEnd(p);
            return;
        }

        if (events & UV_WRITABLE) {
            if (!socketData->messageQueue.empty() && (events & UV_WRITABLE)) {
                Socket(p).cork(true);
                while (true) {
                    SocketData::Queue::Message *messagePtr = socketData->messageQueue.front();
                    ssize_t sent = ::send(Socket(p).getFd(), messagePtr->data, messagePtr->length, MSG_NOSIGNAL);
                    if (sent == (ssize_t) messagePtr->length) {
                        if (messagePtr->callback) {
                            messagePtr->callback(p, messagePtr->callbackData, false, messagePtr->reserved);
                        }
                        socketData->messageQueue.pop();
                        if (socketData->messageQueue.empty()) {
                            // todo, remove bit, don't set directly
                            socketData->poll = UV_READABLE;
                            uv_poll_start(p, UV_READABLE, Socket(p).getPollCallback());
                            break;
                        }
                    } else if (sent == SOCKET_ERROR) {
                        if (errno != EWOULDBLOCK) {
                            STATE::onEnd(p);
                            return;
                        }
                        break;
                    } else {
                        messagePtr->length -= sent;
                        messagePtr->data += sent;
                        break;
                    }
                }
                Socket(p).cork(false);
            }
        }

        if (events & UV_READABLE) {
            int length = recv(Socket(p).getFd(), nodeData->recvBuffer, nodeData->recvLength, 0);
            if (length > 0) {
                STATE::onData(p, nodeData->recvBuffer, length);
            } else if (length <= 0 || (length == SOCKET_ERROR && errno != EWOULDBLOCK)) {
                STATE::onEnd(p);
            }
        }

    }